

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

int __thiscall
Indexing::ClauseCodeTree::LiteralMatcher::init(LiteralMatcher *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  CodeOp **ppCVar2;
  undefined7 extraout_var;
  LitInfo *in_RCX;
  size_t in_R8;
  int in_R9D;
  CodeOp *pCVar3;
  
  CodeTree::Matcher::init(&this->super_Matcher,ctx);
  (this->super_Matcher).linfos = in_RCX;
  (this->super_Matcher).linfoCnt = in_R8;
  this->_eagerlyMatched = false;
  ppCVar2 = (this->eagerResults)._stack;
  (this->eagerResults)._cursor = ppCVar2;
  if (in_R9D != 0) {
    this->_eagerlyMatched = true;
    (this->super_Matcher)._fresh = false;
    pCVar3 = (this->super_Matcher).entry;
    if (pCVar3 != (CodeOp *)0x0) {
      do {
        if (pCVar3->_content != 0 && (pCVar3->_content & 7) == 0) {
          if (ppCVar2 == (this->eagerResults)._end) {
            Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(&this->eagerResults);
            ppCVar2 = (this->eagerResults)._cursor;
          }
          *ppCVar2 = pCVar3;
          ppCVar2 = (this->eagerResults)._cursor + 1;
          (this->eagerResults)._cursor = ppCVar2;
        }
        pCVar3 = pCVar3->_alternative;
      } while (pCVar3 != (CodeOp *)0x0);
    }
    return (int)ppCVar2;
  }
  bVar1 = CodeTree::Matcher::prepareLiteral(&this->super_Matcher);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void ClauseCodeTree::LiteralMatcher::init(CodeTree* tree_, CodeOp* entry_,
					  LitInfo* linfos_, size_t linfoCnt_,
					  bool seekOnlySuccess)
{
  ASS_G(linfoCnt_,0);

  Matcher::init(tree_,entry_);

  linfos=linfos_;
  linfoCnt=linfoCnt_;

  _eagerlyMatched=false;
  eagerResults.reset();

  RSTAT_CTR_INC("LiteralMatcher::init");
  if(seekOnlySuccess) {
    RSTAT_CTR_INC("LiteralMatcher::init - seekOnlySuccess");
    //we are interested only in SUCCESS operations
    //(and those must be at the entry point or its alternatives)

    _eagerlyMatched=true;
    _fresh=false;
    CodeOp* sop=entry;
    while(sop) {
      if(sop->isSuccess()) {
	eagerResults.push(sop);
      }
      sop=sop->alternative();
    }
    return;
  }

  ALWAYS(prepareLiteral());
}